

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  char *__s;
  float fVar1;
  char operator;
  float number;
  byte local_39;
  float local_38;
  float local_34;
  
  puts("Begin Calculations");
  local_34 = 0.0;
  do {
    __isoc99_scanf("%f %c",&local_38,&local_39);
    switch(local_39) {
    case 0x2a:
      fVar1 = local_34 * local_38;
      break;
    case 0x2b:
      fVar1 = local_34 + local_38;
      break;
    case 0x2c:
    case 0x2e:
switchD_001011cf_caseD_2c:
      __s = "Unknown operator.";
LAB_0010120f:
      puts(__s);
      fVar1 = local_34;
      break;
    case 0x2d:
      fVar1 = local_34 - local_38;
      break;
    case 0x2f:
      fVar1 = local_34 / local_38;
      break;
    default:
      if (local_39 == 0x45) {
        __s = "End of program";
        goto LAB_0010120f;
      }
      fVar1 = local_38;
      if (local_39 != 0x53) goto switchD_001011cf_caseD_2c;
    }
    local_34 = fVar1;
    printf("= %f\n",(double)fVar1);
    if (local_39 == 0x45) {
      puts("End of Calculations");
      return 0;
    }
  } while( true );
}

Assistant:

int main() {

    float number;
    char operator;
    float accumulator = 0.0f;

    printf("Begin Calculations\n");
    do {

        scanf("%f %c", &number, &operator);

        switch (operator) {
            case 'S':
                accumulator = number;
                break;
            case '+':
                accumulator += number;
                break;
            case '-':
                accumulator -= number;
                break;
            case '*':
                accumulator *= number;
                break;
            case '/':
                accumulator /= number;
                break;
            case 'E':
                printf("End of program\n");
                break;
            default:
                printf("Unknown operator.\n");
                break;
        }

        printf("= %f\n", accumulator);

    } while (operator != 'E');
    printf("End of Calculations\n");

    return 0;
}